

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

size_t __thiscall google::protobuf::SourceCodeInfo::ByteSizeLong(SourceCodeInfo *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  Rep *pRVar5;
  size_t sVar6;
  RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> *this_00;
  RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> *pRVar7;
  
  sVar4 = internal::ExtensionSet::ByteSize(&(this->field_0)._impl_._extensions_);
  iVar1 = *(int *)((long)&this->field_0 + 0x20);
  this_00 = &(this->field_0)._impl_.location_;
  pRVar7 = this_00;
  if ((*(byte *)((long)&this->field_0 + 0x18) & 1) != 0) {
    pRVar5 = internal::RepeatedPtrFieldBase::rep(&this_00->super_RepeatedPtrFieldBase);
    pRVar7 = (RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> *)pRVar5->elements;
    if (((ulong)(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
      pRVar5 = internal::RepeatedPtrFieldBase::rep(&this_00->super_RepeatedPtrFieldBase);
      this_00 = (RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> *)pRVar5->elements;
    }
  }
  sVar4 = sVar4 + (long)iVar1;
  iVar1 = *(int *)((long)&this->field_0 + 0x20);
  for (; pRVar7 != (RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> *)
                   (&(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar1);
      pRVar7 = (RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> *)
               &(pRVar7->super_RepeatedPtrFieldBase).current_size_) {
    sVar6 = SourceCodeInfo_Location::ByteSizeLong
                      ((SourceCodeInfo_Location *)
                       (pRVar7->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    uVar3 = (uint)sVar6 | 1;
    iVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar4 = sVar4 + sVar6 + (ulong)(iVar2 * 9 + 0x49U >> 6);
  }
  sVar4 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar4,&(this->field_0)._impl_._cached_size_);
  return sVar4;
}

Assistant:

::size_t SourceCodeInfo::ByteSizeLong() const {
  const SourceCodeInfo& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.SourceCodeInfo)
  ::size_t total_size = 0;
  total_size += this_._impl_._extensions_.ByteSize();

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .google.protobuf.SourceCodeInfo.Location location = 1;
    {
      total_size += 1UL * this_._internal_location_size();
      for (const auto& msg : this_._internal_location()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}